

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<3,_0,_9,_0,_9>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int in_ECX;
  VecAccess<float,_4,_3> local_b0;
  Mat3 local_88;
  Mat3 local_64;
  Matrix<float,_3,_3> local_40;
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *evalCtx_local;
  
  local_10 = evalCtx;
  getInputValue<0,9>(&local_64,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  getInputValue<0,9>(&local_88,(MatrixCaseUtils *)local_10,(ShaderEvalContext *)&DAT_00000001,in_ECX
                    );
  tcu::operator/(&local_40,&local_64,&local_88);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)&local_1c,&local_40);
  tcu::Vector<float,_4>::xyz(&local_b0,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_b0,&local_1c);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_40);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_88);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_64);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) / getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}